

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

archive_entry * archive_entry_new2(archive *a)

{
  archive_entry *__s;
  
  __s = (archive_entry *)malloc(0x438);
  if (__s == (archive_entry *)0x0) {
    __s = (archive_entry *)0x0;
  }
  else {
    memset(__s,0,0x438);
    __s->archive = a;
  }
  return __s;
}

Assistant:

struct archive_entry *
archive_entry_new2(struct archive *a)
{
	struct archive_entry *entry;

	entry = (struct archive_entry *)malloc(sizeof(*entry));
	if (entry == NULL)
		return (NULL);
	memset(entry, 0, sizeof(*entry));
	entry->archive = a;
	return (entry);
}